

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeclarationBinderTester_4000_4999.cpp
# Opt level: O2

void __thiscall psy::C::DeclarationBinderTester::case4055(DeclarationBinderTester *this)

{
  Expectation *pEVar1;
  Decl *pDVar2;
  socklen_t __len;
  allocator<char> local_372;
  allocator<char> local_371;
  string local_370;
  string local_350;
  string local_330 [32];
  Expectation local_310;
  Expectation local_258;
  Decl local_1a0;
  Decl local_d8;
  
  std::__cxx11::string::string<std::allocator<char>>
            (local_330,"long long signed long x ;",&local_371);
  Expectation::Expectation(&local_310);
  std::__cxx11::string::string
            ((string *)&local_350,
             (string *)&DeclarationBinder::DiagnosticsReporter::ID_of_InvalidType_abi_cxx11_);
  pEVar1 = Expectation::diagnostic(&local_310,Error,&local_350);
  Decl::Decl(&local_1a0);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_370,"x",&local_372);
  __len = 0;
  pDVar2 = Decl::Object(&local_1a0,&local_370,VariableDeclaration,File);
  pDVar2 = Ty::Basic(&pDVar2->ty_,LongLong_S,None);
  Decl::Decl(&local_d8,pDVar2);
  pEVar1 = Expectation::declaration(pEVar1,&local_d8);
  Expectation::Expectation(&local_258,pEVar1);
  bind(this,(int)local_330,(sockaddr *)&local_258,__len);
  Expectation::~Expectation(&local_258);
  Decl::~Decl(&local_d8);
  std::__cxx11::string::~string((string *)&local_370);
  Decl::~Decl(&local_1a0);
  std::__cxx11::string::~string((string *)&local_350);
  Expectation::~Expectation(&local_310);
  std::__cxx11::string::~string(local_330);
  return;
}

Assistant:

void DeclarationBinderTester::case4055()
{
    bind("long long signed long x ;",
         Expectation()
         .diagnostic(
             Expectation::ErrorOrWarn::Error,
             DeclarationBinder::DiagnosticsReporter::ID_of_InvalidType)
         .declaration(Decl()
                      .Object("x", SymbolKind::VariableDeclaration)
                      .ty_.Basic(BasicTypeKind::LongLong_S)));
}